

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csharp_helpers.cc
# Opt level: O0

string * __thiscall
google::protobuf::compiler::csharp::GetFieldConstantName_abi_cxx11_
          (string *__return_storage_ptr__,csharp *this,FieldDescriptor *field)

{
  AlphaNum *in_RCX;
  AlphaNum local_a8;
  string local_68;
  AlphaNum local_48;
  csharp *local_18;
  FieldDescriptor *field_local;
  
  local_18 = this;
  field_local = (FieldDescriptor *)__return_storage_ptr__;
  GetPropertyName_abi_cxx11_(&local_68,this,field);
  absl::lts_20250127::AlphaNum::AlphaNum<std::allocator<char>>(&local_48,&local_68);
  absl::lts_20250127::AlphaNum::AlphaNum(&local_a8,"FieldNumber");
  absl::lts_20250127::StrCat_abi_cxx11_
            (__return_storage_ptr__,(lts_20250127 *)&local_48,&local_a8,in_RCX);
  std::__cxx11::string::~string((string *)&local_68);
  return __return_storage_ptr__;
}

Assistant:

std::string GetFieldConstantName(const FieldDescriptor* field) {
  return absl::StrCat(GetPropertyName(field), "FieldNumber");
}